

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_GetStateNull_Test::TestBody
          (StatePointer_GetStateNull_Test *this)

{
  AssertHelperData *ptr;
  bool bVar1;
  char *pcVar2;
  Foo **in_RCX;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> local_48;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  undefined1 local_38 [4];
  Foo foo;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  ptr = (AssertHelperData *)((long)&p.m_ptr_and_state + 4);
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&local_48,(pointer_type)ptr,0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  local_48.m_ptr_and_state);
  local_20.data_ = ptr;
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            ((char *)local_38,(char *)&gtest_ar.message_,(Foo **)&local_20,in_RCX);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                   ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                    local_48.m_ptr_and_state);
    local_20.data_ = (AssertHelperData *)0x0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_38,"p.get_state()","0ul",(unsigned_long *)&gtest_ar.message_
               ,(unsigned_long *)&local_20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
    if (bVar1) goto LAB_00120db4;
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  testing::Message::~Message((Message *)&gtest_ar.message_);
LAB_00120db4:
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(StatePointer, GetStateNull) {
	Foo foo;
	state_ptr<Foo> p{&foo, 0};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 0ul);
}